

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::build_function_control_flow_graphs_and_analyze(Compiler *this)

{
  TypedID<(spirv_cross::Types)6> *pTVar1;
  int iVar2;
  ulong uVar3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  size_t sVar5;
  bool bVar6;
  __uniq_ptr_impl<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_> *this_00;
  CFG *this_01;
  SPIRFunction *pSVar7;
  __node_base *p_Var8;
  SPIRBlock *pSVar9;
  Bitset *this_02;
  SPIRVariable *pSVar10;
  Bitset *other;
  long lVar11;
  TypedID<(spirv_cross::Types)6> *pTVar12;
  CFGBuilder handler;
  AnalyzeVariableScopeAccessHandler scope_handler;
  CFGBuilder local_220;
  AnalyzeVariableScopeAccessHandler local_1d8;
  
  local_220.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__CFGBuilder_00465378;
  local_220.function_cfgs._M_h._M_buckets = &local_220.function_cfgs._M_h._M_single_bucket;
  local_220.function_cfgs._M_h._M_bucket_count = 1;
  local_220.function_cfgs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_220.function_cfgs._M_h._M_element_count = 0;
  local_220.function_cfgs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_220.function_cfgs._M_h._M_rehash_policy._M_next_resize = 0;
  local_220.function_cfgs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1d8.super_OpcodeHandler._vptr_OpcodeHandler._0_4_ = (this->ir).default_entry_point.id;
  local_220.compiler = this;
  this_00 = (__uniq_ptr_impl<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_> *)
            ::std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&local_220.function_cfgs,(key_type *)&local_1d8);
  this_01 = (CFG *)operator_new(0x168);
  pSVar7 = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  CFG::CFG(this_01,this,pSVar7);
  ::std::__uniq_ptr_impl<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>::reset
            (this_00,this_01);
  pSVar7 = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar7,&local_220.super_OpcodeHandler);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->function_cfgs)._M_h,&local_220.function_cfgs._M_h);
  uVar3 = (this->function_cfgs)._M_h._M_element_count;
  p_Var8 = &(this->function_cfgs)._M_h._M_before_begin;
  do {
    p_Var8 = p_Var8->_M_nxt;
    if (p_Var8 == (__node_base *)0x0) {
      CFGBuilder::~CFGBuilder(&local_220);
      return;
    }
    pSVar7 = get<spirv_cross::SPIRFunction>(this,(uint32_t)*(size_type *)(p_Var8 + 1));
    AnalyzeVariableScopeAccessHandler::AnalyzeVariableScopeAccessHandler(&local_1d8,this,pSVar7);
    analyze_variable_scope(this,pSVar7,&local_1d8);
    find_function_local_luts(this,pSVar7,&local_1d8,uVar3 < 2);
    pTVar12 = (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    pTVar1 = pTVar12 + (pSVar7->blocks).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size;
    for (; pTVar12 != pTVar1; pTVar12 = pTVar12 + 1) {
      pSVar9 = get<spirv_cross::SPIRBlock>(this,pTVar12->id);
      if (1 < (pSVar9->loop_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size) {
        this_02 = ParsedIR::get_decoration_bitset
                            (&this->ir,
                             (ID)((pSVar9->loop_variables).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
                                 )->id);
        pSVar10 = get<spirv_cross::SPIRVariable>
                            (this,((pSVar9->loop_variables).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
                                  ptr)->id);
        iVar2 = *(int *)&(pSVar10->super_IVariant).field_0xc;
        pTVar4 = (pSVar9->loop_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        sVar5 = (pSVar9->loop_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
        lVar11 = 0;
        do {
          if (sVar5 << 2 == lVar11) goto LAB_00378c03;
          other = ParsedIR::get_decoration_bitset
                            (&this->ir,(ID)*(uint32_t *)((long)&pTVar4->id + lVar11));
          bVar6 = Bitset::operator!=(this_02,other);
          if (bVar6) break;
          pSVar10 = get<spirv_cross::SPIRVariable>
                              (this,((pSVar9->loop_variables).
                                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
                                    ptr)->id);
          lVar11 = lVar11 + 4;
        } while (iVar2 == *(int *)&(pSVar10->super_IVariant).field_0xc);
        pTVar4 = (pSVar9->loop_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        sVar5 = (pSVar9->loop_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
        for (lVar11 = 0; sVar5 << 2 != lVar11; lVar11 = lVar11 + 4) {
          pSVar10 = get<spirv_cross::SPIRVariable>(this,*(uint32_t *)((long)&pTVar4->id + lVar11));
          pSVar10->loop_variable = false;
        }
        (pSVar9->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
        buffer_size = 0;
      }
LAB_00378c03:
    }
    AnalyzeVariableScopeAccessHandler::~AnalyzeVariableScopeAccessHandler(&local_1d8);
  } while( true );
}

Assistant:

void Compiler::build_function_control_flow_graphs_and_analyze()
{
	CFGBuilder handler(*this);
	handler.function_cfgs[ir.default_entry_point].reset(new CFG(*this, get<SPIRFunction>(ir.default_entry_point)));
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	function_cfgs = std::move(handler.function_cfgs);
	bool single_function = function_cfgs.size() <= 1;

	for (auto &f : function_cfgs)
	{
		auto &func = get<SPIRFunction>(f.first);
		AnalyzeVariableScopeAccessHandler scope_handler(*this, func);
		analyze_variable_scope(func, scope_handler);
		find_function_local_luts(func, scope_handler, single_function);

		// Check if we can actually use the loop variables we found in analyze_variable_scope.
		// To use multiple initializers, we need the same type and qualifiers.
		for (auto block : func.blocks)
		{
			auto &b = get<SPIRBlock>(block);
			if (b.loop_variables.size() < 2)
				continue;

			auto &flags = get_decoration_bitset(b.loop_variables.front());
			uint32_t type = get<SPIRVariable>(b.loop_variables.front()).basetype;
			bool invalid_initializers = false;
			for (auto loop_variable : b.loop_variables)
			{
				if (flags != get_decoration_bitset(loop_variable) ||
				    type != get<SPIRVariable>(b.loop_variables.front()).basetype)
				{
					invalid_initializers = true;
					break;
				}
			}

			if (invalid_initializers)
			{
				for (auto loop_variable : b.loop_variables)
					get<SPIRVariable>(loop_variable).loop_variable = false;
				b.loop_variables.clear();
			}
		}
	}
}